

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatCnfReader.c
# Opt level: O0

int xSAT_ReadInt(char **pIn)

{
  bool bVar1;
  ushort **ppuVar2;
  int local_1c;
  int local_14;
  int neg;
  int val;
  char **pIn_local;
  
  local_14 = 0;
  bVar1 = false;
  while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)**pIn] & 0x2000) != 0) {
    *pIn = *pIn + 1;
  }
  if (**pIn == '-') {
    bVar1 = true;
    *pIn = *pIn + 1;
  }
  else if (**pIn == '+') {
    *pIn = *pIn + 1;
  }
  ppuVar2 = __ctype_b_loc();
  if (((*ppuVar2)[(int)**pIn] & 0x800) != 0) {
    while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)**pIn] & 0x800) != 0) {
      local_14 = local_14 * 10 + **pIn + -0x30;
      *pIn = *pIn + 1;
    }
    if (bVar1) {
      local_1c = -local_14;
    }
    else {
      local_1c = local_14;
    }
    return local_1c;
  }
  fprintf(_stderr,"PARSE ERROR! Unexpected char: %c\n",(ulong)(uint)(int)**pIn);
  exit(1);
}

Assistant:

static int xSAT_ReadInt( char ** pIn )
{
    int val = 0;
    int neg = 0;

    for(; isspace(**pIn); (*pIn)++);
    if ( **pIn == '-' )
        neg = 1,
        (*pIn)++;
    else if ( **pIn == '+' )
        (*pIn)++;
    if ( !isdigit(**pIn) )
        fprintf(stderr, "PARSE ERROR! Unexpected char: %c\n", **pIn),
        exit(1);
    while ( isdigit(**pIn) )
        val = val*10 + (**pIn - '0'),
        (*pIn)++;
    return neg ? -val : val;
}